

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O1

ElementMatcherPairs *
testing::internal::FindMaxBipartiteMatching
          (ElementMatcherPairs *__return_storage_ptr__,MatchMatrix *g)

{
  MaxBipartiteMatchState local_50;
  
  MaxBipartiteMatchState::MaxBipartiteMatchState(&local_50,g);
  MaxBipartiteMatchState::Compute(__return_storage_ptr__,&local_50);
  if (local_50.right_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.right_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.right_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.right_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_50.left_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.left_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.left_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.left_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ElementMatcherPairs
FindMaxBipartiteMatching(const MatchMatrix& g) {
  return MaxBipartiteMatchState(g).Compute();
}